

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void cut_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  Fl_Type *o;
  
  if (Fl_Type::current == (Fl_Type *)0x0) {
    fl_beep(0);
    return;
  }
  pcVar2 = cutfname(0);
  iVar1 = write_file(pcVar2,1);
  if (iVar1 != 0) {
    undo_checkpoint();
    set_modflag(1);
    ipasteoffset = 0;
    o = Fl_Type::current;
    do {
      o = o->parent;
      if (o == (Fl_Type *)0x0) {
        delete_all(1);
        return;
      }
    } while (o->selected != '\0');
    delete_all(1);
    select_only(o);
    return;
  }
  pcVar2 = cutfname(0);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  fl_message("Can\'t write %s: %s",pcVar2,pcVar4);
  return;
}

Assistant:

void cut_cb(Fl_Widget *, void *) {
  if (!Fl_Type::current) {
    fl_beep();
    return;
  }
  if (!write_file(cutfname(),1)) {
    fl_message("Can't write %s: %s", cutfname(), strerror(errno));
    return;
  }
  undo_checkpoint();
  set_modflag(1);
  ipasteoffset = 0;
  Fl_Type *p = Fl_Type::current->parent;
  while (p && p->selected) p = p->parent;
  delete_all(1);
  if (p) select_only(p);
}